

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::Resize(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
         *this)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  bool bVar4;
  uint prime;
  BOOL BVar5;
  int iVar6;
  hash_t hVar7;
  Recycler *pRVar8;
  undefined4 *puVar9;
  int *__s;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *dst;
  long lVar10;
  ulong dstCount;
  int *piVar11;
  size_t sVar12;
  undefined1 local_70 [8];
  TrackAllocData data;
  int modIndex;
  
  data._36_4_ = 0x4b;
  prime = PrimePolicy::GetPrime(this->count * 2,(int *)&data.field_0x24);
  if ((int)prime <= this->count) {
    Js::Throw::OutOfMemory();
  }
  dstCount = (ulong)(int)prime;
  local_70 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x165;
  data.plusSize = dstCount;
  pRVar8 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (prime == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
    __s = (int *)&DAT_00000008;
  }
  else {
    sVar12 = 0xffffffffffffffff;
    if (-1 < (int)prime) {
      sVar12 = dstCount * 4;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007c23ad;
      *puVar9 = 0;
    }
    __s = (int *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar8,sVar12);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007c23ad;
      *puVar9 = 0;
    }
    if (0 < (int)prime) {
      memset(__s,0xff,(ulong)prime << 2);
    }
  }
  local_70 = (undefined1  [8])
             &WeakRefDictionaryEntry<Js::PropertyRecord_const,Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x167;
  data.plusSize = dstCount;
  pRVar8 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (prime == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
    dst = (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
           *)&DAT_00000008;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dstCount;
    sVar12 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      sVar12 = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007c23ad;
      *puVar9 = 0;
    }
    if (sVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar4) goto LAB_007c23ad;
      *puVar9 = 0;
    }
    dst = (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
           *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (pRVar8,sVar12);
    if (dst == (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
                *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007c23ad;
      *puVar9 = 0;
    }
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(dst->key).ptr + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar10 = lVar10 + 0x18;
    } while (dstCount * 0x18 != lVar10);
  }
  Memory::
  CopyArray<JsUtil::WeakRefDictionaryEntry<Js::PropertyRecord_const,Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyRecord_const>const>,Memory::Recycler>
            (dst,dstCount,(this->entries).ptr,(long)this->count);
  iVar6 = this->count;
  if ((int)prime <= iVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x169,"(count < newSize)","count < newSize");
    if (!bVar4) {
LAB_007c23ad:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
    iVar6 = this->count;
  }
  this->modFunctionIndex = data._36_4_;
  if (0 < iVar6) {
    piVar11 = &dst->next;
    lVar10 = 0;
    do {
      hVar7 = PrimePolicy::ModPrime
                        (((WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
                           *)(piVar11 + -1))->hash,prime,this->modFunctionIndex);
      *piVar11 = __s[hVar7];
      __s[hVar7] = (int)lVar10;
      lVar10 = lVar10 + 1;
      piVar11 = piVar11 + 6;
    } while (lVar10 < this->count);
  }
  Memory::Recycler::WBSetBit((char *)&this->buckets);
  (this->buckets).ptr = __s;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
  this->size = prime;
  Memory::Recycler::WBSetBit((char *)&this->entries);
  (this->entries).ptr = dst;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
  return;
}

Assistant:

void Resize()
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int newSize = PrimePolicy::GetSize(count * 2, &modIndex);

            if (newSize <= count)
            {
                // throw OOM if we can't increase the dictionary size
                Js::Throw::OutOfMemory();
            }

            int* newBuckets = RecyclerNewArrayLeaf(recycler, int, newSize);
            for (int i = 0; i < newSize; i++) newBuckets[i] = -1;
            EntryType* newEntries = RecyclerNewArray(recycler, EntryType, newSize);
            CopyArray<EntryType, Field(const RecyclerWeakReference<TKey>*)>(newEntries, newSize, entries, count);
            AnalysisAssert(count < newSize);
            modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                uint bucket = PrimePolicy::GetBucket(newEntries[i].hash, newSize, modFunctionIndex);
                newEntries[i].next = newBuckets[bucket];
                newBuckets[bucket] = i;
            }
            buckets = newBuckets;
            size = newSize;
            entries = newEntries;
        }